

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O2

void __thiscall
CaDiCaL::LratChecker::add_derived_clause
          (LratChecker *this,uint64_t id,bool param_2,vector<int,_std::allocator<int>_> *c,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  int64_t *piVar1;
  Internal *pIVar2;
  pointer piVar3;
  uint *puVar4;
  bool bVar5;
  LratCheckerClause **ppLVar6;
  FILE *__timer;
  int *lit;
  uint *puVar7;
  double s;
  double s_00;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  
  pIVar2 = this->internal;
  if ((pIVar2->profiles).checking.level <= (pIVar2->opts).profile) {
    Internal::time(pIVar2,(time_t *)id);
    Internal::start_profiling(pIVar2,&(pIVar2->profiles).checking,s);
  }
  (this->stats).added = (this->stats).added + 1;
  piVar1 = &(this->stats).derived;
  *piVar1 = *piVar1 + 1;
  import_clause(this,c);
  this->last_id = id;
  this->current_id = id;
  if (this->size_clauses != 0) {
    ppLVar6 = find(this,id);
    if (*ppLVar6 != (LratCheckerClause *)0x0) {
      fatal_message_start();
      fputs("different clause with id ",_stderr);
      fprintf(_stderr,"%ld",id);
      fputs(" already present\n",_stderr);
      fatal_message_end();
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,proof_chain);
  bVar5 = check(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60);
  if (bVar5) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8,
               proof_chain);
    __timer = (FILE *)&stack0xffffffffffffffb8;
    bVar5 = check_resolution(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &stack0xffffffffffffffb8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffffb8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    if (bVar5) {
      insert(this);
      goto LAB_006635fb;
    }
  }
  else {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
  }
  fatal_message_start();
  fputs("failed to check derived clause:\n",_stderr);
  puVar4 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar7 = (uint *)(this->imported_clause).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4;
      puVar7 = puVar7 + 1) {
    fprintf(_stderr,"%d ",(ulong)*puVar7);
  }
  __timer = _stderr;
  fputc(0x30,_stderr);
  fatal_message_end();
LAB_006635fb:
  piVar3 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  pIVar2 = this->internal;
  if ((pIVar2->profiles).checking.level <= (pIVar2->opts).profile) {
    Internal::time(pIVar2,(time_t *)__timer);
    Internal::stop_profiling(pIVar2,&(pIVar2->profiles).checking,s_00);
  }
  return;
}

Assistant:

void LratChecker::add_derived_clause (uint64_t id, bool,
                                      const vector<int> &c,
                                      const vector<uint64_t> &proof_chain) {
  START (checking);
  LOG (c, "LRAT CHECKER addition of derived clause[%" PRIu64 "]", id);
  stats.added++;
  stats.derived++;
  import_clause (c);
  last_id = id;
  assert (id == current_id + 1);
  current_id = id;
  if (size_clauses) {
    LratCheckerClause **p = find (id), *d = *p;
    if (d) {
      fatal_message_start ();
      fputs ("different clause with id ", stderr);
      fprintf (stderr, "%" PRId64, id);
      fputs (" already present\n", stderr);
      fatal_message_end ();
    }
  }
  assert (id);
  if (!check (proof_chain) || !check_resolution (proof_chain)) {
    fatal_message_start ();
    fputs ("failed to check derived clause:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  } else
    insert ();
  imported_clause.clear ();
  STOP (checking);
}